

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textrender.cpp
# Opt level: O2

int __thiscall CGlyphMap::GetCharGlyph(CGlyphMap *this,int Chr,FT_Face_conflict *pFace)

{
  FT_Face_conflict pFVar1;
  int iVar2;
  int iVar3;
  int i;
  long lVar4;
  long lVar5;
  FT_Face_conflict *ppFVar6;
  
  lVar5 = (long)Chr;
  iVar2 = FT_Get_Char_Index(this->m_DefaultFace,lVar5);
  pFVar1 = this->m_DefaultFace;
  *pFace = pFVar1;
  if (iVar2 == 0 && pFVar1 != (FT_Face_conflict)0x0) {
    if ((this->m_VariantFace == (FT_Face_conflict)0x0) ||
       (iVar3 = FT_Get_Char_Index(this->m_VariantFace,lVar5), iVar3 == 0)) {
      ppFVar6 = this->m_aFallbackFaces;
      iVar2 = 0;
      for (lVar4 = 0; lVar4 < this->m_NumFallbackFaces; lVar4 = lVar4 + 1) {
        if ((*ppFVar6 != (FT_Face_conflict)0x0) &&
           (iVar3 = FT_Get_Char_Index(*ppFVar6,lVar5), iVar3 != 0)) goto LAB_001275b8;
        ppFVar6 = ppFVar6 + 1;
      }
    }
    else {
      ppFVar6 = &this->m_VariantFace;
LAB_001275b8:
      *pFace = *ppFVar6;
      iVar2 = iVar3;
    }
  }
  return iVar2;
}

Assistant:

int CGlyphMap::GetCharGlyph(int Chr, FT_Face *pFace)
{
	int GlyphIndex = FT_Get_Char_Index(m_DefaultFace, (FT_ULong)Chr);
	*pFace = m_DefaultFace;

	if(!m_DefaultFace || GlyphIndex)
		return GlyphIndex;

	if(m_VariantFace)
	{
		GlyphIndex = FT_Get_Char_Index(m_VariantFace, (FT_ULong)Chr);
		if(GlyphIndex)
		{
			*pFace = m_VariantFace;
			return GlyphIndex;
		}
	}

	for(int i = 0; i < m_NumFallbackFaces; ++i)
	{
		if(m_aFallbackFaces[i])
		{
			GlyphIndex = FT_Get_Char_Index(m_aFallbackFaces[i], (FT_ULong)Chr);
			if(GlyphIndex)
			{
				*pFace = m_aFallbackFaces[i];
				return GlyphIndex;
			}
		}
	}

	return 0;
}